

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.h
# Opt level: O1

long * __thiscall mocker::Token::val<long>(Token *this)

{
  element_type *peVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (this->valPtr).super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(peVar1,&ValBase::typeinfo,&Val<long>::typeinfo,0);
  }
  if (lVar2 == 0) {
    lVar2 = 0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00 = (this->valPtr).super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  if (lVar2 != 0) {
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return (long *)(lVar2 + 8);
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/token.h"
                ,0x7c,"const T &mocker::Token::val() const [T = long]");
}

Assistant:

const T &val() const {
    detail::checkTokenType<T>();
    auto ptr = std::dynamic_pointer_cast<Val<T>>(valPtr);
    assert(ptr);
    return ptr->val;
  }